

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O2

u32 u32Bitrev(u32 w)

{
  uint uVar1;
  
  uVar1 = w >> 0x18 | (w & 0xff0000) >> 8 | (w & 0xff00) << 8 | w << 0x18;
  uVar1 = (uVar1 & 0xf0f0f0f) << 4 | uVar1 >> 4 & 0xf0f0f0f;
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333) * 4;
  return (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555) * 2;
}

Assistant:

u32 u32Bitrev(register u32 w)
{
	w = ((w >> 1) & 0x55555555) | ((w & 0x55555555) << 1);
	w = ((w >> 2) & 0x33333333) | ((w & 0x33333333) << 2);
	w = ((w >> 4) & 0x0F0F0F0F) | ((w & 0x0F0F0F0F) << 4);
	w = ((w >> 8) & 0x00FF00FF) | ((w & 0x00FF00FF) << 8);
	w = (w >> 16) | (w << 16);
	return w;
}